

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * GenImageCellular(Image *__return_storage_ptr__,int width,int height,int tileSize)

{
  ulong uVar1;
  int iVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  void *__ptr;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int j;
  ulong uVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  ulong local_90;
  
  pvVar8 = malloc((long)(height * width) << 2);
  iVar2 = width / tileSize;
  uVar11 = (height / tileSize) * iVar2;
  __ptr = malloc((long)(int)uVar11 * 8);
  if (0 < (int)uVar11) {
    uVar13 = 0;
    do {
      uVar1 = (ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff;
      iVar4 = GetRandomValue(0,tileSize + -1);
      iVar5 = GetRandomValue(0,tileSize + -1);
      *(float *)((long)__ptr + uVar13 * 8) =
           (float)(iVar5 + (int)((long)uVar1 % (long)iVar2) * tileSize);
      *(float *)((long)__ptr + uVar13 * 8 + 4) =
           (float)(iVar4 + (int)((long)uVar1 / (long)iVar2) * tileSize);
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  if (0 < height) {
    local_90 = 0;
    do {
      if (0 < width) {
        lVar10 = local_90 * (uint)width;
        iVar4 = (int)((long)((ulong)(uint)((int)local_90 >> 0x1f) << 0x20 | local_90 & 0xffffffff) /
                     (long)tileSize);
        uVar13 = 0;
        do {
          iVar5 = (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                       (long)tileSize);
          iVar12 = (iVar4 + -1) * iVar2 + -1 + iVar5;
          iVar7 = -1;
          fVar18 = 65536.0;
          do {
            iVar6 = iVar7 + iVar5;
            if (iVar6 < iVar2 && -1 < iVar6) {
              lVar14 = -1;
              iVar6 = iVar12;
              do {
                lVar9 = iVar4 + lVar14;
                if (lVar9 < height / tileSize && -1 < lVar9) {
                  dVar17 = hypot((double)((int)uVar13 -
                                         (int)*(float *)((long)__ptr + (long)iVar6 * 8)),
                                 (double)((int)local_90 -
                                         (int)*(float *)((long)__ptr + (long)iVar6 * 8 + 4)));
                  fVar15 = (float)dVar17;
                  fVar16 = fVar15;
                  if (fVar18 <= fVar15) {
                    fVar16 = fVar18;
                  }
                  fVar18 = (float)(~-(uint)NAN(fVar18) & (uint)fVar16 |
                                  -(uint)NAN(fVar18) & (uint)fVar15);
                }
                lVar14 = lVar14 + 1;
                iVar6 = iVar6 + iVar2;
              } while (lVar14 != 2);
            }
            iVar7 = iVar7 + 1;
            iVar12 = iVar12 + 1;
          } while (iVar7 != 2);
          iVar5 = (int)((fVar18 * 256.0) / (float)tileSize);
          uVar3 = (undefined1)iVar5;
          if (0xfe < iVar5) {
            uVar3 = 0xff;
          }
          *(undefined1 *)((long)pvVar8 + uVar13 * 4 + lVar10 * 4) = uVar3;
          *(undefined1 *)((long)pvVar8 + uVar13 * 4 + lVar10 * 4 + 1) = uVar3;
          *(undefined1 *)((long)pvVar8 + uVar13 * 4 + lVar10 * 4 + 2) = uVar3;
          *(undefined1 *)((long)pvVar8 + uVar13 * 4 + lVar10 * 4 + 3) = 0xff;
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uint)width);
      }
      local_90 = local_90 + 1;
    } while (local_90 != (uint)height);
  }
  free(__ptr);
  __return_storage_ptr__->data = pvVar8;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageCellular(int width, int height, int tileSize)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    int seedsPerRow = width/tileSize;
    int seedsPerCol = height/tileSize;
    int seedCount = seedsPerRow*seedsPerCol;

    Vector2 *seeds = (Vector2 *)RL_MALLOC(seedCount*sizeof(Vector2));

    for (int i = 0; i < seedCount; i++)
    {
        int y = (i/seedsPerRow)*tileSize + GetRandomValue(0, tileSize - 1);
        int x = (i%seedsPerRow)*tileSize + GetRandomValue(0, tileSize - 1);
        seeds[i] = (Vector2){ (float)x, (float)y };
    }

    for (int y = 0; y < height; y++)
    {
        int tileY = y/tileSize;

        for (int x = 0; x < width; x++)
        {
            int tileX = x/tileSize;

            float minDistance = 65536.0f; //(float)strtod("Inf", NULL);

            // Check all adjacent tiles
            for (int i = -1; i < 2; i++)
            {
                if ((tileX + i < 0) || (tileX + i >= seedsPerRow)) continue;

                for (int j = -1; j < 2; j++)
                {
                    if ((tileY + j < 0) || (tileY + j >= seedsPerCol)) continue;

                    Vector2 neighborSeed = seeds[(tileY + j)*seedsPerRow + tileX + i];

                    float dist = (float)hypot(x - (int)neighborSeed.x, y - (int)neighborSeed.y);
                    minDistance = (float)fmin(minDistance, dist);
                }
            }

            // I made this up, but it seems to give good results at all tile sizes
            int intensity = (int)(minDistance*256.0f/tileSize);
            if (intensity > 255) intensity = 255;

            pixels[y*width + x] = (Color){ intensity, intensity, intensity, 255 };
        }
    }

    RL_FREE(seeds);

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}